

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O0

void __thiscall
firmata::FirmataMarshaller::sendSysex
          (FirmataMarshaller *this,uint8_t command,size_t bytec,uint8_t *bytev)

{
  FirmataMarshaller *__n;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  ulong local_30;
  size_t i;
  uint8_t *bytev_local;
  size_t bytec_local;
  uint8_t command_local;
  FirmataMarshaller *this_local;
  
  if (this->FirmataStream != (Stream *)0x0) {
    __n = this;
    serial_wiring::Stream::write(this->FirmataStream,0xf0,(void *)bytec,(size_t)this);
    serial_wiring::Stream::write(this->FirmataStream,(uint)command,__buf,(size_t)__n);
    __buf_00 = extraout_RDX;
    for (local_30 = 0; local_30 < bytec; local_30 = local_30 + 1) {
      __n = (FirmataMarshaller *)0x0;
      encodeByteStream(this,1,bytev + local_30,0);
      __buf_00 = extraout_RDX_00;
    }
    serial_wiring::Stream::write(this->FirmataStream,0xf7,__buf_00,(size_t)__n);
  }
  return;
}

Assistant:

void FirmataMarshaller::sendSysex(uint8_t command, size_t bytec, uint8_t *bytev)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  size_t i;
  FirmataStream->write(START_SYSEX);
  FirmataStream->write(command);
  for (i = 0; i < bytec; ++i) {
    encodeByteStream(sizeof(bytev[i]), reinterpret_cast<uint8_t *>(&bytev[i]));
  }
  FirmataStream->write(END_SYSEX);
}